

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_boundaries_state.cpp
# Opt level: O3

void __thiscall
duckdb::WindowBoundariesState::FrameEnd
          (WindowBoundariesState *this,DataChunk *bounds,idx_t row_idx,idx_t count,
          WindowInputExpression *boundary_end,ValidityMask *order_mask,
          optional_ptr<duckdb::WindowCursor,_true> range)

{
  FrameBounds *prev;
  size_type *psVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  idx_t *piVar4;
  idx_t *piVar5;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> __ptr;
  unsigned_long *puVar6;
  size_type sVar7;
  WindowCursor *pWVar8;
  undefined1 auVar9 [16];
  WindowBoundariesState *pWVar10;
  bool bVar11;
  reference pvVar12;
  reference pvVar13;
  idx_t iVar14;
  unsigned_long uVar15;
  type pWVar16;
  idx_t iVar17;
  OutOfRangeException *pOVar18;
  InternalException *this_00;
  ulong uVar19;
  data_ptr_t pdVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  idx_t local_a0;
  unsigned_long n;
  undefined1 local_70 [16];
  size_type local_60;
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *local_58;
  idx_t *local_50;
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *local_48;
  optional_ptr<duckdb::WindowCursor,_true> *local_40;
  WindowBoundariesState *local_38;
  long lVar25;
  
  local_38 = this;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,0);
  psVar1 = (size_type *)pvVar12->data;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,1);
  pdVar2 = pvVar12->data;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,3);
  pdVar3 = pvVar12->data;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,4);
  piVar4 = (idx_t *)pvVar12->data;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,5);
  piVar5 = (idx_t *)pvVar12->data;
  pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,7);
  pWVar10 = local_38;
  pdVar20 = pvVar12->data;
  local_60 = *psVar1;
  (local_38->prev).start = *piVar4;
  (local_38->prev).end = *piVar5;
  local_58 = (unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
             piVar5;
  local_50 = piVar4;
  if (((local_38->has_preceding_range != false) || (local_38->has_following_range == true)) &&
     ((local_38->range_lo).ptr != range.ptr)) {
    (local_38->range_lo).ptr = range.ptr;
    optional_ptr<duckdb::WindowCursor,_true>::CheckValid(&local_38->range_lo);
    WindowCursor::Copy((WindowCursor *)&n);
    uVar15 = n;
    n = 0;
    __ptr._M_head_impl =
         (pWVar10->range_hi).
         super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
         super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
         super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
    (pWVar10->range_hi).
    super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
    super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
    super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl = (WindowCursor *)uVar15;
    if ((__ptr._M_head_impl != (WindowCursor *)0x0) &&
       (::std::default_delete<duckdb::WindowCursor>::operator()
                  ((default_delete<duckdb::WindowCursor> *)&pWVar10->range_hi,__ptr._M_head_impl),
       n != 0)) {
      ::std::default_delete<duckdb::WindowCursor>::operator()
                ((default_delete<duckdb::WindowCursor> *)&n,(WindowCursor *)n);
    }
  }
  auVar9 = _DAT_01d9fb10;
  if (pWVar10->end_boundary < (EXPR_FOLLOWING_RANGE|CURRENT_ROW_ROWS)) {
    prev = &pWVar10->prev;
    switch(pWVar10->end_boundary) {
    default:
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      n = (unsigned_long)local_70;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&n,"Unsupported window end boundary","");
      InternalException::InternalException(this_00,(string *)&n);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case UNBOUNDED_FOLLOWING:
      pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,7);
      pvVar13 = vector<duckdb::Vector,_true>::operator[](&bounds->data,1);
      Vector::Reference(pvVar12,pvVar13);
      return;
    case CURRENT_ROW_RANGE:
    case CURRENT_ROW_GROUPS:
      pvVar12 = vector<duckdb::Vector,_true>::operator[](&bounds->data,7);
      pvVar13 = vector<duckdb::Vector,_true>::operator[](&bounds->data,3);
      Vector::Reference(pvVar12,pvVar13);
      pdVar20 = pdVar3;
      goto LAB_01198211;
    case CURRENT_ROW_ROWS:
      if (count == 0) {
        return;
      }
      lVar25 = count - 1;
      auVar27._8_4_ = (int)row_idx;
      auVar27._0_8_ = row_idx;
      auVar27._12_4_ = (int)(row_idx >> 0x20);
      lVar22 = row_idx + (long)DAT_01d9fb00;
      lVar23 = auVar27._8_8_ + DAT_01d9fb00._8_8_;
      auVar26._8_4_ = (int)lVar25;
      auVar26._0_8_ = lVar25;
      auVar26._12_4_ = (int)((ulong)lVar25 >> 0x20);
      uVar21 = 0;
      auVar26 = auVar26 ^ _DAT_01d9fb10;
      auVar24 = _DAT_01d9fb00;
      do {
        auVar27 = auVar24 ^ auVar9;
        if ((bool)(~(auVar27._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar27._0_4_ ||
                    auVar26._4_4_ < auVar27._4_4_) & 1)) {
          *(long *)(pdVar20 + uVar21 * 8) = lVar22 + 1;
        }
        if ((auVar27._12_4_ != auVar26._12_4_ || auVar27._8_4_ <= auVar26._8_4_) &&
            auVar27._12_4_ <= auVar26._12_4_) {
          *(long *)(pdVar20 + uVar21 * 8 + 8) = lVar23 + 1;
        }
        uVar21 = uVar21 + 2;
        lVar22 = lVar22 + 2;
        lVar23 = lVar23 + 2;
        lVar25 = auVar24._8_8_;
        auVar24._0_8_ = auVar24._0_8_ + 2;
        auVar24._8_8_ = lVar25 + 2;
      } while ((count + 1 & 0xfffffffffffffffe) != uVar21);
      break;
    case EXPR_PRECEDING_ROWS:
      if (count == 0) {
        return;
      }
      iVar17 = 0;
      do {
        pvVar12 = vector<duckdb::Vector,_true>::operator[]
                            (&boundary_end->chunk->data,boundary_end->col_idx);
        iVar14 = 0;
        if (boundary_end->scalar == false) {
          iVar14 = iVar17;
        }
        bVar11 = TrySubtractOperator::Operation<long,long,long>
                           (row_idx + 1 + iVar17,*(int64_t *)(pvVar12->data + iVar14 * 8),
                            (int64_t *)&n);
        if (bVar11) {
          uVar15 = n;
          if ((long)n < 1) {
            uVar15 = 0;
          }
        }
        else {
          uVar15 = *(unsigned_long *)(pdVar2 + iVar17 * 8);
        }
        *(unsigned_long *)(pdVar20 + iVar17 * 8) = uVar15;
        iVar17 = iVar17 + 1;
      } while (count != iVar17);
      break;
    case EXPR_FOLLOWING_ROWS:
      if (count == 0) {
        return;
      }
      iVar17 = 0;
      do {
        pvVar12 = vector<duckdb::Vector,_true>::operator[]
                            (&boundary_end->chunk->data,boundary_end->col_idx);
        iVar14 = 0;
        if (boundary_end->scalar == false) {
          iVar14 = iVar17;
        }
        bVar11 = TryAddOperator::Operation<long,long,long>
                           (row_idx + 1 + iVar17,*(int64_t *)(pvVar12->data + iVar14 * 8),
                            (int64_t *)&n);
        if (bVar11) {
          uVar15 = n;
          if ((long)n < 1) {
            uVar15 = 0;
          }
        }
        else {
          uVar15 = *(unsigned_long *)(pdVar2 + iVar17 * 8);
        }
        *(unsigned_long *)(pdVar20 + iVar17 * 8) = uVar15;
        iVar17 = iVar17 + 1;
      } while (count != iVar17);
      break;
    case EXPR_PRECEDING_RANGE:
      if (count == 0) {
        return;
      }
      local_58 = &pWVar10->range_hi;
      uVar21 = 0;
      local_a0 = row_idx;
      do {
        pvVar12 = vector<duckdb::Vector,_true>::operator[]
                            (&boundary_end->chunk->data,boundary_end->col_idx);
        puVar6 = (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (boundary_end->scalar == true) {
          if ((puVar6 != (unsigned_long *)0x0) && ((*puVar6 & 1) == 0)) goto LAB_0119855e;
LAB_011984c2:
          iVar17 = local_50[uVar21];
          prev->start = iVar17;
          sVar7 = psVar1[uVar21];
          if (sVar7 != local_60) {
            (pWVar10->prev).end = pWVar10->valid_end;
            local_60 = sVar7;
          }
          optional_ptr<duckdb::WindowCursor,_true>::CheckValid(&pWVar10->range_lo);
          pWVar8 = (pWVar10->range_lo).ptr;
          pWVar16 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                    ::operator*(local_58);
          iVar17 = FindOrderedRangeBound<false>
                             (pWVar8,pWVar16,pWVar10->range_sense,iVar17,local_a0 + 1,
                              pWVar10->end_boundary,boundary_end,uVar21,prev);
          (pWVar10->prev).end = iVar17;
        }
        else {
          if ((puVar6 == (unsigned_long *)0x0) ||
             ((puVar6[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)) goto LAB_011984c2;
LAB_0119855e:
          iVar17 = *(idx_t *)(pdVar3 + uVar21 * 8);
        }
        local_a0 = local_a0 + 1;
        *(idx_t *)(pdVar20 + uVar21 * 8) = iVar17;
        uVar21 = uVar21 + 1;
      } while (count != uVar21);
      break;
    case EXPR_FOLLOWING_RANGE:
      if (count == 0) {
        return;
      }
      local_40 = &pWVar10->range_lo;
      local_48 = &pWVar10->range_hi;
      uVar21 = 0;
      do {
        pvVar12 = vector<duckdb::Vector,_true>::operator[]
                            (&boundary_end->chunk->data,boundary_end->col_idx);
        puVar6 = (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (boundary_end->scalar == true) {
          if ((puVar6 != (unsigned_long *)0x0) && ((*puVar6 & 1) == 0)) goto LAB_01198757;
LAB_011986ba:
          iVar17 = *(idx_t *)(local_58 + uVar21);
          prev->start = local_50[uVar21];
          sVar7 = psVar1[uVar21];
          if (sVar7 != local_60) {
            (pWVar10->prev).end = iVar17;
            local_60 = sVar7;
          }
          optional_ptr<duckdb::WindowCursor,_true>::CheckValid(local_40);
          pWVar8 = (pWVar10->range_lo).ptr;
          pWVar16 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>
                    ::operator*(local_48);
          iVar17 = FindOrderedRangeBound<false>
                             (pWVar8,pWVar16,pWVar10->range_sense,row_idx + uVar21,iVar17,
                              pWVar10->end_boundary,boundary_end,uVar21,prev);
          (pWVar10->prev).end = iVar17;
        }
        else {
          if ((puVar6 == (unsigned_long *)0x0) ||
             ((puVar6[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)) goto LAB_011986ba;
LAB_01198757:
          iVar17 = *(idx_t *)(pdVar3 + uVar21 * 8);
        }
        *(idx_t *)(pdVar20 + uVar21 * 8) = iVar17;
        uVar21 = uVar21 + 1;
      } while (count != uVar21);
      break;
    case EXPR_PRECEDING_GROUPS:
      if (count == 0) {
        return;
      }
      uVar21 = 0;
      do {
        pvVar12 = vector<duckdb::Vector,_true>::operator[]
                            (&boundary_end->chunk->data,boundary_end->col_idx);
        puVar6 = (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (boundary_end->scalar == true) {
          if ((puVar6 != (unsigned_long *)0x0) && ((*puVar6 & 1) == 0)) goto LAB_011982cb;
LAB_0119826d:
          iVar14 = *(idx_t *)(pdVar3 + uVar21 * 8);
          iVar17 = psVar1[uVar21];
          pvVar12 = vector<duckdb::Vector,_true>::operator[]
                              (&boundary_end->chunk->data,boundary_end->col_idx);
          uVar19 = 0;
          if (boundary_end->scalar == false) {
            uVar19 = uVar21;
          }
          uVar15 = *(unsigned_long *)(pvVar12->data + uVar19 * 8);
          if ((long)uVar15 < 0) {
            pOVar18 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
            n = (unsigned_long)local_70;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&n,"Invalid GROUPS PRECEDING value","");
            OutOfRangeException::OutOfRangeException(pOVar18,(string *)&n);
            __cxa_throw(pOVar18,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error)
            ;
          }
          if (uVar15 != 0) {
            n = uVar15;
            iVar14 = FindPrevStart(order_mask,iVar17,iVar14,&n);
          }
        }
        else {
          if ((puVar6 == (unsigned_long *)0x0) ||
             ((puVar6[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)) goto LAB_0119826d;
LAB_011982cb:
          iVar14 = *(idx_t *)(pdVar3 + uVar21 * 8);
        }
        *(idx_t *)(pdVar20 + uVar21 * 8) = iVar14;
        uVar21 = uVar21 + 1;
      } while (count != uVar21);
      break;
    case EXPR_FOLLOWING_GROUPS:
      if (count == 0) {
        return;
      }
      uVar21 = 0;
      do {
        pvVar12 = vector<duckdb::Vector,_true>::operator[]
                            (&boundary_end->chunk->data,boundary_end->col_idx);
        puVar6 = (pvVar12->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (boundary_end->scalar == true) {
          if ((puVar6 != (unsigned_long *)0x0) && ((*puVar6 & 1) == 0)) goto LAB_0119842a;
LAB_011983c6:
          iVar14 = *(idx_t *)(pdVar3 + uVar21 * 8);
          iVar17 = *(idx_t *)(pdVar2 + uVar21 * 8);
          pvVar12 = vector<duckdb::Vector,_true>::operator[]
                              (&boundary_end->chunk->data,boundary_end->col_idx);
          uVar19 = 0;
          if (boundary_end->scalar == false) {
            uVar19 = uVar21;
          }
          uVar15 = *(unsigned_long *)(pvVar12->data + uVar19 * 8);
          if ((long)uVar15 < 0) {
            pOVar18 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
            n = (unsigned_long)local_70;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&n,"Invalid GROUPS FOLLOWING value","");
            OutOfRangeException::OutOfRangeException(pOVar18,(string *)&n);
            __cxa_throw(pOVar18,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error)
            ;
          }
          if (uVar15 != 0) {
            n = uVar15;
            iVar14 = FindNextStart(order_mask,iVar14 + 1,iVar17,&n);
          }
        }
        else {
          if ((puVar6 == (unsigned_long *)0x0) ||
             ((puVar6[uVar21 >> 6] >> (uVar21 & 0x3f) & 1) != 0)) goto LAB_011983c6;
LAB_0119842a:
          iVar14 = *(idx_t *)(pdVar3 + uVar21 * 8);
        }
        *(idx_t *)(pdVar20 + uVar21 * 8) = iVar14;
        uVar21 = uVar21 + 1;
      } while (count != uVar21);
    }
  }
  else {
LAB_01198211:
    if (count == 0) {
      return;
    }
  }
  iVar17 = 0;
  do {
    uVar21 = psVar1[iVar17];
    if (psVar1[iVar17] < *(ulong *)(pdVar20 + iVar17 * 8)) {
      uVar21 = *(ulong *)(pdVar20 + iVar17 * 8);
    }
    if (*(ulong *)(pdVar2 + iVar17 * 8) <= uVar21) {
      uVar21 = *(ulong *)(pdVar2 + iVar17 * 8);
    }
    *(ulong *)(pdVar20 + iVar17 * 8) = uVar21;
    iVar17 = iVar17 + 1;
  } while (count != iVar17);
  return;
}

Assistant:

void WindowBoundariesState::FrameEnd(DataChunk &bounds, idx_t row_idx, const idx_t count,
                                     WindowInputExpression &boundary_end, const ValidityMask &order_mask,
                                     optional_ptr<WindowCursor> range) {
	auto partition_begin_data = FlatVector::GetData<const idx_t>(bounds.data[PARTITION_BEGIN]);
	auto partition_end_data = FlatVector::GetData<idx_t>(bounds.data[PARTITION_END]);
	auto peer_end_data = FlatVector::GetData<idx_t>(bounds.data[PEER_END]);
	auto valid_begin_data = FlatVector::GetData<const idx_t>(bounds.data[VALID_BEGIN]);
	auto valid_end_data = FlatVector::GetData<const idx_t>(bounds.data[VALID_END]);
	auto frame_end_data = FlatVector::GetData<idx_t>(bounds.data[FRAME_END]);

	idx_t window_end = NumericLimits<idx_t>::Maximum();

	//	Reset previous range hints
	idx_t prev_partition = partition_begin_data[0];
	prev.start = valid_begin_data[0];
	prev.end = valid_end_data[0];

	if (has_preceding_range || has_following_range) {
		if (range_lo.get() != range.get()) {
			range_lo = range.get();
			range_hi = range_lo->Copy();
		}
	}

	switch (end_boundary) {
	case WindowBoundary::CURRENT_ROW_ROWS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			frame_end_data[chunk_idx] = row_idx + 1;
		}
		break;
	case WindowBoundary::CURRENT_ROW_RANGE:
	case WindowBoundary::CURRENT_ROW_GROUPS:
		// in RANGE or GROUPS mode it means that the frame starts or ends with the current row's
		// first or last peer in the ORDER BY ordering
		bounds.data[FRAME_END].Reference(bounds.data[PEER_END]);
		frame_end_data = peer_end_data;
		break;
	case WindowBoundary::UNBOUNDED_FOLLOWING:
		bounds.data[FRAME_END].Reference(bounds.data[PARTITION_END]);
		// No need to clamp
		return;
	case WindowBoundary::EXPR_PRECEDING_ROWS: {
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			int64_t computed_start;
			if (!TrySubtractOperator::Operation(int64_t(row_idx + 1), boundary_end.GetCell<int64_t>(chunk_idx),
			                                    computed_start)) {
				window_end = partition_end_data[chunk_idx];
			} else {
				window_end = UnsafeNumericCast<idx_t>(MaxValue<int64_t>(computed_start, 0));
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	}
	case WindowBoundary::EXPR_FOLLOWING_ROWS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			int64_t computed_start;
			if (!TryAddOperator::Operation(int64_t(row_idx + 1), boundary_end.GetCell<int64_t>(chunk_idx),
			                               computed_start)) {
				window_end = partition_end_data[chunk_idx];
			} else {
				window_end = UnsafeNumericCast<idx_t>(MaxValue<int64_t>(computed_start, 0));
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	case WindowBoundary::EXPR_PRECEDING_RANGE:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_end.CellIsNull(chunk_idx)) {
				window_end = peer_end_data[chunk_idx];
			} else {
				const auto valid_start = valid_begin_data[chunk_idx];
				prev.start = valid_start;
				const auto cur_partition = partition_begin_data[chunk_idx];
				if (cur_partition != prev_partition) {
					prev.end = valid_end;
					prev_partition = cur_partition;
				}
				window_end = FindOrderedRangeBound<false>(*range_lo, *range_hi, range_sense, valid_start, row_idx + 1,
				                                          end_boundary, boundary_end, chunk_idx, prev);
				prev.end = window_end;
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	case WindowBoundary::EXPR_FOLLOWING_RANGE:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_end.CellIsNull(chunk_idx)) {
				window_end = peer_end_data[chunk_idx];
			} else {
				const auto valid_end = valid_end_data[chunk_idx];
				prev.start = valid_begin_data[chunk_idx];
				const auto cur_partition = partition_begin_data[chunk_idx];
				if (cur_partition != prev_partition) {
					prev.end = valid_end;
					prev_partition = cur_partition;
				}
				window_end = FindOrderedRangeBound<false>(*range_lo, *range_hi, range_sense, row_idx, valid_end,
				                                          end_boundary, boundary_end, chunk_idx, prev);
				prev.end = window_end;
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	case WindowBoundary::EXPR_PRECEDING_GROUPS:
		// In GROUPS mode, the offset is an integer indicating that the frame starts or ends that many peer groups
		// before or after the current row's peer group, where a peer group is a group of rows that are equivalent
		// according to the window's ORDER BY clause.
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_end.CellIsNull(chunk_idx)) {
				window_end = peer_end_data[chunk_idx];
			} else {
				//	Count peer groups backwards.
				const auto peer_end = peer_end_data[chunk_idx];
				const auto partition_begin = partition_begin_data[chunk_idx];
				const auto boundary = boundary_end.GetCell<int64_t>(chunk_idx);
				if (boundary < 0) {
					throw OutOfRangeException("Invalid GROUPS PRECEDING value");
				} else if (!boundary) {
					window_end = peer_end;
				} else {
					auto n = UnsafeNumericCast<idx_t>(boundary);
					window_end = FindPrevStart(order_mask, partition_begin, peer_end, n);
				}
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	case WindowBoundary::EXPR_FOLLOWING_GROUPS:
		for (idx_t chunk_idx = 0; chunk_idx < count; ++chunk_idx, ++row_idx) {
			if (boundary_end.CellIsNull(chunk_idx)) {
				window_end = peer_end_data[chunk_idx];
			} else {
				//	Count peer groups forward.
				const auto peer_end = peer_end_data[chunk_idx];
				const auto partition_end = partition_end_data[chunk_idx];
				const auto boundary = boundary_end.GetCell<int64_t>(chunk_idx);
				if (boundary < 0) {
					throw OutOfRangeException("Invalid GROUPS FOLLOWING value");
				} else if (!boundary) {
					window_end = peer_end;
				} else {
					auto n = UnsafeNumericCast<idx_t>(boundary);
					window_end = FindNextStart(order_mask, peer_end + 1, partition_end, n);
				}
			}
			frame_end_data[chunk_idx] = window_end;
		}
		break;
	case WindowBoundary::UNBOUNDED_PRECEDING:
	case WindowBoundary::INVALID:
		throw InternalException("Unsupported window end boundary");
	}

	ClampFrame(count, frame_end_data, partition_begin_data, partition_end_data);
}